

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::View<float,false,std::allocator<unsigned_long>>::reshape<unsigned_long*>
          (View<float,false,std::allocator<unsigned_long>> *this,unsigned_long *begin,
          unsigned_long *end)

{
  pointer data;
  unsigned_long *begin_00;
  bool assertion;
  unsigned_long uVar1;
  size_t sVar2;
  CoordinateOrder *externalCoordinateOrder;
  CoordinateOrder *internalCoordinateOrder;
  allocator<float> local_2a [2];
  unsigned_long local_28;
  size_t size;
  unsigned_long *end_local;
  unsigned_long *begin_local;
  View<float,_false,_std::allocator<unsigned_long>_> *this_local;
  
  size = (size_t)end;
  end_local = begin;
  begin_local = (unsigned_long *)this;
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
  assertion = View<float,_false,_std::allocator<unsigned_long>_>::isSimple
                        ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
  marray_detail::Assert<bool>(assertion);
  uVar1 = std::accumulate<unsigned_long*,unsigned_long,std::multiplies<unsigned_long>>
                    (end_local,size,1);
  local_28 = uVar1;
  sVar2 = View<float,_false,_std::allocator<unsigned_long>_>::size
                    ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
  marray_detail::Assert<bool>(uVar1 == sVar2);
  begin_00 = end_local;
  sVar2 = size;
  data = *(pointer *)this;
  externalCoordinateOrder =
       View<float,_false,_std::allocator<unsigned_long>_>::coordinateOrder
                 ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
  internalCoordinateOrder =
       View<float,_false,_std::allocator<unsigned_long>_>::coordinateOrder
                 ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
  std::allocator<float>::allocator(local_2a);
  assign<unsigned_long*>
            (this,begin_00,(unsigned_long *)sVar2,data,externalCoordinateOrder,
             internalCoordinateOrder,local_2a);
  std::allocator<float>::~allocator(local_2a);
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
  return;
}

Assistant:

inline void
View<T, isConst, A>::reshape
(
    ShapeIterator begin,
    ShapeIterator end
)
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_DEBUG || isSimple());
    if(!MARRAY_NO_ARG_TEST) {
        std::size_t size = std::accumulate(begin, end, static_cast<std::size_t>(1), 
            std::multiplies<std::size_t>());
        marray_detail::Assert(size == this->size());
    }
    assign(begin, end, data_, coordinateOrder(), coordinateOrder());
    testInvariant();
}